

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O2

void __thiscall Atari::ST::ConcreteMachine::set_gpip_input(ConcreteMachine *this)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  undefined1 local_60 [24];
  ACIA *local_48;
  undefined1 local_40 [24];
  ReadDelegate local_28;
  
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::operator->
            ((JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *)local_60)
  ;
  JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::operator->
            ((JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1> *)(local_40 + 0x10));
  bVar1 = DMAController::get_interrupt_line((DMAController *)local_28._vptr_ReadDelegate);
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_40);
  bVar2 = Motorola::ACIA::ACIA::get_interrupt_line((ACIA *)local_40._8_8_);
  if (bVar2) {
    bVar3 = 0;
  }
  else {
    JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
              ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)(local_60 + 0x10));
    bVar2 = Motorola::ACIA::ACIA::get_interrupt_line(local_48);
    bVar3 = !bVar2 << 4;
  }
  Motorola::MFP68901::MFP68901::set_port_input
            ((MFP68901 *)local_60._8_8_,~bVar1 << 5 | bVar3 | 0xce);
  std::
  unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                 *)local_60);
  return;
}

Assistant:

void set_gpip_input() {
			/*
				Atari ST GPIP bits:

					GPIP 7: monochrome monitor detect
					GPIP 6: RS-232 ring indicator
					GPIP 5: FD/HD interrupt
					GPIP 4: keyboard/MIDI interrupt
					GPIP 3: unused
					GPIP 2: RS-232 clear to send
					GPIP 1: RS-232 carrier detect
					GPIP 0: centronics busy
			*/
			mfp_->set_port_input(
				0x80 |	// b7: Monochrome monitor detect (0 = is monochrome).
				0x40 |	// b6: RS-232 ring indicator.
				(dma_->get_interrupt_line() ? 0x00 : 0x20) |	// b5: FD/HS interrupt (0 = interrupt requested).
				((keyboard_acia_->get_interrupt_line() || midi_acia_->get_interrupt_line()) ? 0x00 : 0x10) |	// b4: Keyboard/MIDI interrupt (0 = interrupt requested).
				0x08 |	// b3: Unused
				0x04 |	// b2: RS-232 clear to send.
				0x02 |	// b1 : RS-232 carrier detect.
				0x00	// b0: Centronics busy (1 = busy).
			);
		}